

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::DumpAuxNoReg
               (OpCode op,OpLayoutAuxNoReg *playout,FunctionBody *dumpFunction,
               ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  AuxArray<Js::FuncInfoEntry> *pAVar4;
  ParseableFunctionInfo *pPVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  undefined6 in_register_0000003a;
  long lVar7;
  ulong uVar8;
  
  if ((int)CONCAT62(in_register_0000003a,op) != 0xda) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x58b,"(false)","Unknown OpCode for OpLayoutType::AuxNoReg");
    if (bVar2) {
      *puVar6 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pAVar4 = ByteCodeReader::ReadAuxArray<Js::FuncInfoEntry>(playout->Offset,dumpFunction);
  Output::Print(L" %d [",(ulong)pAVar4->count);
  if (pAVar4->count != 0) {
    lVar7 = 4;
    uVar8 = 0;
    do {
      pPVar5 = ParseableFunctionInfo::GetNestedFunctionForExecution
                         (&dumpFunction->super_ParseableFunctionInfo,
                          *(uint *)((long)&pAVar4->count + lVar7));
      if (lVar7 != 4) {
        Output::Print(L", ");
      }
      iVar3 = (*(pPVar5->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(pPVar5);
      Output::Print(L"%s",CONCAT44(extraout_var,iVar3));
      if (1 < uVar8) break;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar8 < pAVar4->count);
  }
  Output::Print(L"]");
  return;
}

Assistant:

void
    ByteCodeDumper::DumpAuxNoReg(OpCode op, const unaligned OpLayoutAuxNoReg * playout, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case Js::OpCode::InitCachedFuncs:
            {
                const Js::FuncInfoArray *arr = reader.ReadAuxArray<FuncInfoEntry>(playout->Offset, dumpFunction);
                Output::Print(_u(" %d ["), arr->count);
                for (uint i = 0; i < arr->count && i < 3; i++)
                {
                    Js::ParseableFunctionInfo *info = dumpFunction->GetNestedFunctionForExecution(arr->elements[i].nestedIndex);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), info->GetDisplayName());
                }
                Output::Print(_u("]"));
                break;
            }
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutType::AuxNoReg");
                break;
        }
    }